

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.hxx
# Opt level: O1

void MPIABI_Waitany_cold_1(void)

{
  undefined4 *in_RDI;
  
  in_RDI[6] = *in_RDI;
  *(undefined8 *)(in_RDI + 7) = *(undefined8 *)(in_RDI + 1);
  return;
}

Assistant:

~WPI_StatusPtr() {
    MPI_Status *mpi_status_ptr = (MPI_Status *)wrapped_status_ptr;
    if (mpi_status_ptr != MPI_STATUS_IGNORE &&
        mpi_status_ptr != MPI_STATUSES_IGNORE) {
      wrapped_status_ptr->MPI_SOURCE = mpi_status_ptr->MPI_SOURCE;
      wrapped_status_ptr->MPI_TAG = mpi_status_ptr->MPI_TAG;
      wrapped_status_ptr->MPI_ERROR = mpi_status_ptr->MPI_ERROR;
    }
  }